

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O0

void __thiscall grid::grid(grid *this,int size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  entity ***pppeVar6;
  entity **ppeVar7;
  bool **ppbVar8;
  bool *pbVar9;
  vector<entity_*,_std::allocator<entity_*>_> local_58;
  undefined1 local_40 [8];
  vector<entity_*,_std::allocator<entity_*>_> entitiesToBeAdded;
  int local_20;
  int j_1;
  int i_1;
  int j;
  int i;
  int size_local;
  grid *this_local;
  
  this->_vptr_grid = (_func_int **)&PTR__grid_0010ec78;
  this->size = size;
  this->medkitsDiscovered = false;
  this->zombiesVisible = false;
  this->ammunitionDiscovered = false;
  memcpy(this->directionOperations,&DAT_00109e40,0x40);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)size;
  uVar5 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pppeVar6 = (entity ***)operator_new__(uVar5);
  this->board = pppeVar6;
  for (i_1 = 0; i_1 < size; i_1 = i_1 + 1) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)size;
    uVar5 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    ppeVar7 = (entity **)operator_new__(uVar5);
    this->board[i_1] = ppeVar7;
    for (j_1 = 0; j_1 < size; j_1 = j_1 + 1) {
      this->board[i_1][j_1] = (entity *)0x0;
    }
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)size;
  uVar5 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  ppbVar8 = (bool **)operator_new__(uVar5);
  this->visitedByChichonne = ppbVar8;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)size;
  uVar5 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  ppbVar8 = (bool **)operator_new__(uVar5);
  this->visitedByDerek = ppbVar8;
  for (local_20 = 0; local_20 < size; local_20 = local_20 + 1) {
    pbVar9 = (bool *)operator_new__((long)size);
    this->visitedByChichonne[local_20] = pbVar9;
    pbVar9 = (bool *)operator_new__((long)size);
    this->visitedByDerek[local_20] = pbVar9;
    for (entitiesToBeAdded.super__Vector_base<entity_*,_std::allocator<entity_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        entitiesToBeAdded.super__Vector_base<entity_*,_std::allocator<entity_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ < size;
        entitiesToBeAdded.super__Vector_base<entity_*,_std::allocator<entity_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ =
             entitiesToBeAdded.super__Vector_base<entity_*,_std::allocator<entity_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      this->visitedByChichonne[local_20]
      [entitiesToBeAdded.super__Vector_base<entity_*,_std::allocator<entity_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_] = false;
      this->visitedByDerek[local_20]
      [entitiesToBeAdded.super__Vector_base<entity_*,_std::allocator<entity_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_] = false;
    }
  }
  createEntities((vector<entity_*,_std::allocator<entity_*>_> *)local_40,this);
  std::vector<entity_*,_std::allocator<entity_*>_>::vector
            (&local_58,(vector<entity_*,_std::allocator<entity_*>_> *)local_40);
  deploy(this,&local_58);
  std::vector<entity_*,_std::allocator<entity_*>_>::~vector(&local_58);
  std::vector<entity_*,_std::allocator<entity_*>_>::~vector
            ((vector<entity_*,_std::allocator<entity_*>_> *)local_40);
  return;
}

Assistant:

grid::grid(int size) : size(size),zombiesVisible(false), medkitsDiscovered(false), ammunitionDiscovered(false) {
    board = new entity **[size];
    for (int i = 0; i < size; ++i) {
        board[i] = new entity *[size];
        for (int j = 0; j < size; ++j) {
            board[i][j] = nullptr;
        }
    }

    visitedByChichonne = new bool*[size];
    visitedByDerek = new bool*[size];
    for (int i = 0; i < size; ++i) {
        visitedByChichonne[i] = new bool[size];
        visitedByDerek[i] = new bool[size];
        for (int j = 0; j < size; ++j) {
            visitedByChichonne[i][j] = false;
            visitedByDerek[i][j] = false;
        }
    }
    std::vector<entity *> entitiesToBeAdded = createEntities();
    deploy(entitiesToBeAdded);
}